

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Constr.c
# Opt level: O1

void Llb_ManComputeIndCase(Aig_Man_t *p,DdManager *dd,Vec_Int_t *vNodes)

{
  void *pvVar1;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  Vec_Ptr_t *vBdds;
  void **__s;
  DdNode *pDVar5;
  DdNode *g;
  int iVar6;
  int iVar7;
  long lVar8;
  Aig_Obj_t *pObj;
  
  iVar7 = p->vObjs->nSize;
  vBdds = (Vec_Ptr_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar7 - 1U) {
    iVar6 = iVar7;
  }
  vBdds->nSize = 0;
  vBdds->nCap = iVar6;
  if (iVar6 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar6 << 3);
  }
  vBdds->pArray = __s;
  vBdds->nSize = iVar7;
  memset(__s,0,(long)iVar7 << 3);
  pDVar5 = Cudd_ReadOne(dd);
  Cudd_Ref(pDVar5);
  iVar7 = p->pConst1->Id;
  if (((long)iVar7 < 0) || (vBdds->nSize <= iVar7)) {
LAB_00923506:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
  }
  vBdds->pArray[iVar7] = pDVar5;
  if (0 < p->nTruePis) {
    lVar8 = 0;
    do {
      if (p->vCis->nSize <= lVar8) goto LAB_009234e7;
      pvVar1 = p->vCis->pArray[lVar8];
      pDVar5 = Cudd_bddIthVar(dd,p->nObjs[2] + (int)lVar8);
      Cudd_Ref(pDVar5);
      iVar7 = *(int *)((long)pvVar1 + 0x24);
      if (((long)iVar7 < 0) || (vBdds->nSize <= iVar7)) goto LAB_00923506;
      vBdds->pArray[iVar7] = pDVar5;
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->nTruePis);
  }
  if (0 < p->nRegs) {
    iVar7 = 0;
    do {
      uVar4 = p->nTruePos + iVar7;
      if (((int)uVar4 < 0) || (p->vCos->nSize <= (int)uVar4)) goto LAB_009234e7;
      piVar2 = (int *)p->vCos->pArray[uVar4];
      pDVar5 = *(DdNode **)(piVar2 + 10);
      Cudd_Ref(pDVar5);
      if (((piVar2[6] & 7U) != 3) || (*piVar2 < p->nTruePos)) {
        __assert_fail("Saig_ObjIsLi(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                      ,0x57,"Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar4 = (*piVar2 - p->nTruePos) + p->nTruePis;
      if (((int)uVar4 < 0) || (p->vCis->nSize <= (int)uVar4)) goto LAB_009234e7;
      iVar6 = *(int *)((long)p->vCis->pArray[uVar4] + 0x24);
      if (((long)iVar6 < 0) || (vBdds->nSize <= iVar6)) goto LAB_00923506;
      vBdds->pArray[iVar6] = pDVar5;
      iVar7 = iVar7 + 1;
    } while (iVar7 < p->nRegs);
  }
  if (0 < vNodes->nSize) {
    lVar8 = 0;
    do {
      uVar4 = vNodes->pArray[lVar8];
      if (uVar4 < 2) {
        pVVar3 = p->vObjs;
        if (pVVar3 == (Vec_Ptr_t *)0x0) {
          pObj = (Aig_Obj_t *)0x0;
        }
        else {
          if (pVVar3->nSize <= lVar8) {
LAB_009234e7:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pObj = (Aig_Obj_t *)pVVar3->pArray[lVar8];
        }
        g = Llb_ManComputeIndCase_rec(p,pObj,dd,vBdds);
        pDVar5 = (DdNode *)(pObj->field_5).pData;
        if ((uVar4 & 1) == 0) {
          pDVar5 = (DdNode *)((ulong)pDVar5 ^ 1);
          g = (DdNode *)((ulong)g ^ 1);
        }
        iVar7 = Cudd_bddLeq(dd,pDVar5,g);
        if (iVar7 == 0) {
          if (vNodes->nSize <= lVar8) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          vNodes->pArray[lVar8] = -1;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vNodes->nSize);
  }
  if (0 < vBdds->nSize) {
    lVar8 = 0;
    do {
      if ((DdNode *)vBdds->pArray[lVar8] != (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,(DdNode *)vBdds->pArray[lVar8]);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vBdds->nSize);
  }
  if (vBdds->pArray != (void **)0x0) {
    free(vBdds->pArray);
    vBdds->pArray = (void **)0x0;
  }
  free(vBdds);
  return;
}

Assistant:

void Llb_ManComputeIndCase( Aig_Man_t * p, DdManager * dd, Vec_Int_t * vNodes )
{
    Vec_Ptr_t * vBdds;
    Aig_Obj_t * pObj;
    DdNode * bFunc;
    int i, Entry;
    vBdds = Vec_PtrStart( Aig_ManObjNumMax(p) );
    bFunc = Cudd_ReadOne(dd); Cudd_Ref( bFunc );
    Vec_PtrWriteEntry( vBdds, Aig_ObjId(Aig_ManConst1(p)), bFunc );
    Saig_ManForEachPi( p, pObj, i )
    {
        bFunc = Cudd_bddIthVar( dd, Aig_ManCiNum(p) + i );  Cudd_Ref( bFunc );
        Vec_PtrWriteEntry( vBdds, Aig_ObjId(pObj), bFunc );
    }
    Saig_ManForEachLi( p, pObj, i )
    {
        bFunc = (DdNode *)pObj->pData;  Cudd_Ref( bFunc );
        Vec_PtrWriteEntry( vBdds, Aig_ObjId(Saig_ObjLiToLo(p, pObj)), bFunc );
    }
    Vec_IntForEachEntry( vNodes, Entry, i )
    { 
        if ( Entry != 0 && Entry != 1 )
            continue;
        pObj = Aig_ManObj( p, i );
        bFunc = Llb_ManComputeIndCase_rec( p, pObj, dd, vBdds );
        if ( Entry == 0 )
        {
//            Extra_bddPrint( dd, Cudd_Not(pObj->pData) );  printf( "\n" );
//            Extra_bddPrint( dd, Cudd_Not(bFunc) );        printf( "\n" );
            if ( !Cudd_bddLeq( dd, Cudd_Not(pObj->pData), Cudd_Not(bFunc) ) )
                Vec_IntWriteEntry( vNodes, i, -1 );
        }
        else if ( Entry == 1 )
        {
//            Extra_bddPrint( dd, pObj->pData );  printf( "\n" );
//            Extra_bddPrint( dd, bFunc );        printf( "\n" );
            if ( !Cudd_bddLeq( dd, (DdNode *)pObj->pData, bFunc ) )
                Vec_IntWriteEntry( vNodes, i, -1 );
        }
    }
    Vec_PtrForEachEntry( DdNode *, vBdds, bFunc, i )
        if ( bFunc )
            Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vBdds );
}